

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O1

bool __thiscall
glcts::PipelineStatisticsQueryTestFunctional5::executeTest
          (PipelineStatisticsQueryTestFunctional5 *this,GLenum current_query_target)

{
  _draw_call_type *draw_call_type_ptr;
  ostringstream *this_00;
  Context *pCVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  GLenum value;
  _draw_call_type draw_call;
  string local_248;
  _primitive_type *local_228;
  Functions *local_220;
  uint index_data [3];
  float vertex_data [6];
  _test_execution_result run_result;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar4 = (*((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  local_220 = (Functions *)CONCAT44(extraout_var,iVar4);
  run_result.result_qo_int = 0x7fffffff;
  run_result.result_qo_int64 = 0x7fffffffffffffff;
  run_result.result_qo_uint = 0xffffffff;
  run_result.result_qo_uint64 = 0xffffffffffffffff;
  run_result.result_int = 0x7fffffff;
  run_result.result_int64 = 0x7fffffffffffffff;
  run_result.result_uint = 0xffffffff;
  run_result.result_uint64 = 0xffffffffffffffff;
  run_result.int64_written = false;
  run_result.uint64_written = false;
  vertex_data[0] = -0.1;
  vertex_data[1] = 0.2;
  vertex_data[2] = 0.2;
  vertex_data[3] = -0.7;
  vertex_data[4] = 0.5;
  vertex_data[5] = -0.5;
  draw_call = DRAW_CALL_TYPE_GLDRAWARRAYS;
  index_data[2] = 0;
  index_data[0] = 2;
  index_data[1] = 1;
  *(undefined1 **)
   &(this->super_PipelineStatisticsQueryTestFunctionalBase).
    m_indirect_draw_call_baseinstance_argument = &DAT_100000001;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_count_argument = 3;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_first_argument = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_primcount_argument =
       4;
  PipelineStatisticsQueryTestFunctionalBase::initVBO
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,vertex_data,0x18,index_data,0xc,
             3,4,1,0,1);
  PipelineStatisticsQueryTestFunctionalBase::initVAO
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,2);
  local_228 = &(this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_primitive_type;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_primitive_type =
       PRIMITIVE_TYPE_PATCHES;
  draw_call_type_ptr =
       &(this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_draw_call_type;
  bVar3 = true;
  do {
    *draw_call_type_ptr = draw_call;
    bVar2 = PipelineStatisticsQueryUtilities::isDrawCallSupported(draw_call,local_220);
    if (bVar2) {
      pCVar1 = (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.m_context;
      bVar2 = PipelineStatisticsQueryUtilities::executeQuery
                        (current_query_target,
                         (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id,
                         (this->super_PipelineStatisticsQueryTestFunctionalBase).m_bo_qo_id,
                         PipelineStatisticsQueryTestFunctionalBase::queryCallbackDrawCallHandler,
                         this,pCVar1->m_renderCtx,
                         (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                         super_TestCase.super_TestNode.m_testCtx,pCVar1->m_contextInfo,&run_result);
      if (bVar2) {
        bVar2 = PipelineStatisticsQueryUtilities::verifyResultValues
                          (&run_result,1,&executeTest::expected_value,
                           (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id != 0,
                           current_query_target,draw_call_type_ptr,local_228,false,
                           (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                           super_TestCase.super_TestNode.m_testCtx,
                           VERIFICATION_TYPE_EQUAL_OR_GREATER);
        bVar3 = (bool)(bVar2 & bVar3);
      }
      else {
        local_1b0._0_8_ =
             ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Could not retrieve test run results for query target [",0x36)
        ;
        PipelineStatisticsQueryUtilities::getStringForEnum_abi_cxx11_
                  (&local_248,(PipelineStatisticsQueryUtilities *)(ulong)current_query_target,value)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,local_248._M_dataplus._M_p,local_248._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        bVar3 = false;
      }
    }
    draw_call = draw_call + DRAW_CALL_TYPE_GLDRAWARRAYSINDIRECT;
  } while (draw_call != DRAW_CALL_TYPE_COUNT);
  return bVar3;
}

Assistant:

bool PipelineStatisticsQueryTestFunctional5::executeTest(glw::GLenum current_query_target)
{
	const glw::Functions&									 gl		= m_context.getRenderContext().getFunctions();
	bool													 result = true;
	PipelineStatisticsQueryUtilities::_test_execution_result run_result;

	/* Sanity check: This method should only be called for GL_TESS_CONTROL_SHADER_PATCHES_ARB and
	 * GL_TESS_EVALUATION_SHADER_INVOCATIONS_ARB queries. */
	DE_ASSERT(current_query_target == GL_TESS_CONTROL_SHADER_PATCHES_ARB ||
			  current_query_target == GL_TESS_EVALUATION_SHADER_INVOCATIONS_ARB);

	/* Set up VBO. */
	const unsigned int n_vertex_components = 2;
	const float		   vertex_data[]	   = {
		-0.1f, 0.2f, 0.2f, -0.7f, 0.5f, -0.5f,
	};
	const unsigned int index_data[] = { 2, 1, 0 };

	m_indirect_draw_call_baseinstance_argument = 1;
	m_indirect_draw_call_basevertex_argument   = 1;
	m_indirect_draw_call_count_argument		   = 3; /* default GL_PATCH_VERTICES value */
	m_indirect_draw_call_first_argument		   = 0;
	m_indirect_draw_call_primcount_argument	= 4;

	initVBO(vertex_data, sizeof(vertex_data), index_data, sizeof(index_data), m_indirect_draw_call_count_argument,
			m_indirect_draw_call_primcount_argument, m_indirect_draw_call_baseinstance_argument,
			m_indirect_draw_call_first_argument, m_indirect_draw_call_basevertex_argument);

	initVAO(n_vertex_components);

	/* Set up the primitive type */
	m_current_primitive_type = PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_PATCHES;

	/* Iterate through all draw call types */
	for (unsigned int n_draw_call_type = 0; n_draw_call_type < PipelineStatisticsQueryUtilities::DRAW_CALL_TYPE_COUNT;
		 ++n_draw_call_type)
	{
		m_current_draw_call_type = (PipelineStatisticsQueryUtilities::_draw_call_type)n_draw_call_type;

		/* Only continue if the draw call is supported by the context */
		if (!PipelineStatisticsQueryUtilities::isDrawCallSupported(m_current_draw_call_type, gl))
		{
			continue;
		}

		/* Execute the query */
		if (!PipelineStatisticsQueryUtilities::executeQuery(
				current_query_target, m_qo_id, m_bo_qo_id, queryCallbackDrawCallHandler,
				(PipelineStatisticsQueryTestFunctionalBase*)this, m_context.getRenderContext(), m_testCtx,
				m_context.getContextInfo(), &run_result))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Could not retrieve test run results for query target "
														   "["
							   << PipelineStatisticsQueryUtilities::getStringForEnum(current_query_target) << "]"
							   << tcu::TestLog::EndMessage;

			result = false;
		}
		else
		{
			static const glw::GLuint64 expected_value = 1; /* as per test spec */

			/* Compare it against query result values */
			result &= PipelineStatisticsQueryUtilities::verifyResultValues(
				run_result, 1, &expected_value, m_qo_id != 0, /* should_check_qo_bo_values */
				current_query_target, &m_current_draw_call_type, &m_current_primitive_type,
				false, /* is_primitive_restart_enabled */
				m_testCtx, PipelineStatisticsQueryUtilities::VERIFICATION_TYPE_EQUAL_OR_GREATER);

		} /* if (run results were obtained successfully) */
	}	 /* for (all draw call types) */

	return result;
}